

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool __thiscall
wallet::LegacyScriptPubKeyMan::CanProvide
          (LegacyScriptPubKeyMan *this,CScript *script,SignatureData *sigdata)

{
  long lVar1;
  IsMineResult IVar2;
  int iVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  byte bVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  IVar2 = anon_unknown_1::IsMineInner(&this->super_LegacyDataSPKM,script,TOP,false);
  bVar6 = 1;
  if (1 < IVar2 - WATCH_ONLY) {
    ProduceSignature(&(this->super_LegacyDataSPKM).super_FillableSigningProvider.
                      super_SigningProvider,DUMMY_SIGNATURE_CREATOR,script,sigdata);
    if ((sigdata->signatures)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      p_Var4 = (sigdata->signatures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var5 = &(sigdata->signatures)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var4 != p_Var5) {
        bVar6 = 0;
        do {
          iVar3 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1d])
                            (this,p_Var4 + 1);
          bVar6 = bVar6 | (byte)iVar3;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
        } while ((_Rb_tree_header *)p_Var4 != p_Var5);
        goto LAB_00c087b7;
      }
    }
    bVar6 = 0;
  }
LAB_00c087b7:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar6 & 1);
}

Assistant:

bool LegacyScriptPubKeyMan::CanProvide(const CScript& script, SignatureData& sigdata)
{
    IsMineResult ismine = IsMineInner(*this, script, IsMineSigVersion::TOP, /* recurse_scripthash= */ false);
    if (ismine == IsMineResult::SPENDABLE || ismine == IsMineResult::WATCH_ONLY) {
        // If ismine, it means we recognize keys or script ids in the script, or
        // are watching the script itself, and we can at least provide metadata
        // or solving information, even if not able to sign fully.
        return true;
    } else {
        // If, given the stuff in sigdata, we could make a valid signature, then we can provide for this script
        ProduceSignature(*this, DUMMY_SIGNATURE_CREATOR, script, sigdata);
        if (!sigdata.signatures.empty()) {
            // If we could make signatures, make sure we have a private key to actually make a signature
            bool has_privkeys = false;
            for (const auto& key_sig_pair : sigdata.signatures) {
                has_privkeys |= HaveKey(key_sig_pair.first);
            }
            return has_privkeys;
        }
        return false;
    }
}